

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O0

DdNode * zddPortToBddStep(DdManager *dd,DdNode *f,int depth)

{
  DdNode *f_00;
  DdNode *pDVar1;
  DdNode *h;
  uint local_64;
  uint level;
  uint index;
  DdNode *var;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  DdNode *zero;
  DdNode *one;
  int depth_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)dd->one;
  if (f == dd->zero) {
    dd_local = (DdManager *)((ulong)dd_local ^ 1);
  }
  else if (depth != dd->sizeZ) {
    if (f->index == 0x7fffffff) {
      local_64 = f->index;
    }
    else {
      local_64 = dd->permZ[f->index];
    }
    f_00 = cuddUniqueInter(dd,dd->invpermZ[depth],(DdNode *)dd_local,(DdNode *)((ulong)dd_local ^ 1)
                          );
    if (f_00 == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) + 1;
      if ((uint)depth < local_64) {
        pDVar1 = zddPortToBddStep(dd,f,depth + 1);
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,f_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          dd_local = (DdManager *)cuddBddIteRecur(dd,f_00,(DdNode *)((ulong)dd_local ^ 1),pDVar1);
          if (dd_local == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,f_00);
            Cudd_RecursiveDeref(dd,pDVar1);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,f_00);
            Cudd_RecursiveDeref(dd,pDVar1);
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
          }
        }
      }
      else {
        dd_local = (DdManager *)cuddCacheLookup1(dd,Cudd_zddPortToBdd,f);
        if (dd_local == (DdManager *)0x0) {
          pDVar1 = zddPortToBddStep(dd,(f->type).kids.T,depth + 1);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,f_00);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
            h = zddPortToBddStep(dd,(f->type).kids.E,depth + 1);
            if (h == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
              dd_local = (DdManager *)cuddBddIteRecur(dd,f_00,pDVar1,h);
              if (dd_local == (DdManager *)0x0) {
                Cudd_RecursiveDeref(dd,f_00);
                Cudd_RecursiveDeref(dd,pDVar1);
                Cudd_RecursiveDeref(dd,h);
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDeref(dd,f_00);
                Cudd_RecursiveDeref(dd,pDVar1);
                Cudd_RecursiveDeref(dd,h);
                *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
                cuddCacheInsert1(dd,Cudd_zddPortToBdd,f,(DdNode *)dd_local);
              }
            }
          }
        }
        else {
          Cudd_RecursiveDeref(dd,f_00);
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
zddPortToBddStep(
  DdManager * dd /* manager */,
  DdNode * f /* ZDD to be converted */,
  int  depth /* recursion depth */)
{
    DdNode *one, *zero, *T, *E, *res, *var;
    unsigned int index;
    unsigned int level;

    statLine(dd);
    one = DD_ONE(dd);
    zero = DD_ZERO(dd);
    if (f == zero) return(Cudd_Not(one));

    if (depth == dd->sizeZ) return(one);

    index = dd->invpermZ[depth];
    level = cuddIZ(dd,f->index);
    var = cuddUniqueInter(dd,index,one,Cudd_Not(one));
    if (var == NULL) return(NULL);
    cuddRef(var);

    if (level > (unsigned) depth) {
        E = zddPortToBddStep(dd,f,depth+1);
        if (E == NULL) {
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(E);
        res = cuddBddIteRecur(dd,var,Cudd_Not(one),E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd,var);
            Cudd_RecursiveDeref(dd,E);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,E);
        cuddDeref(res);
        return(res);
    }

    res = cuddCacheLookup1(dd,Cudd_zddPortToBdd,f);
    if (res != NULL) {
        Cudd_RecursiveDeref(dd,var);
        return(res);
    }

    T = zddPortToBddStep(dd,cuddT(f),depth+1);
    if (T == NULL) {
        Cudd_RecursiveDeref(dd,var);
        return(NULL);
    }
    cuddRef(T);
    E = zddPortToBddStep(dd,cuddE(f),depth+1);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = cuddBddIteRecur(dd,var,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,T);
        Cudd_RecursiveDeref(dd,E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,var);
    Cudd_RecursiveDeref(dd,T);
    Cudd_RecursiveDeref(dd,E);
    cuddDeref(res);

    cuddCacheInsert1(dd,Cudd_zddPortToBdd,f,res);

    return(res);

}